

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntCooperativeMatrixType
          (ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_00;
  Instruction *this_00;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  bVar1 = IsCooperativeMatrixNVType(this,id);
  if ((!bVar1) && (bVar1 = IsCooperativeMatrixKHRType(this,id), !bVar1)) {
    return false;
  }
  this_00 = FindDef(this,id);
  id_00 = Instruction::word(this_00,2);
  bVar1 = IsUnsignedIntScalarType(this,id_00);
  return bVar1;
}

Assistant:

bool ValidationState_t::IsUnsignedIntCooperativeMatrixType(uint32_t id) const {
  if (!IsCooperativeMatrixNVType(id) && !IsCooperativeMatrixKHRType(id))
    return false;
  return IsUnsignedIntScalarType(FindDef(id)->word(2));
}